

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atf-c.c
# Opt level: O0

void microatf_fail_require(char *msg,...)

{
  microatf_context_t *context_00;
  undefined8 uVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  int line;
  char *file;
  va_list args_2;
  undefined1 local_58 [8];
  va_list args_1;
  undefined1 local_38 [8];
  va_list args;
  microatf_context_t *context;
  char *msg_local;
  
  uVar1 = local_130;
  context_00 = microatf_context;
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_130 = in_RSI;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  if (microatf_context->expect == MICROATF_EXPECT_FAIL) {
    args[0].overflow_arg_area = local_138;
    args[0]._0_8_ = &stack0x00000008;
    local_38._4_4_ = 0x30;
    local_38._0_4_ = 8;
    microatf_context_write_result_pack
              (microatf_context,"expected_failure",-1,msg,(__va_list_tag *)local_38);
    microatf_context_exit(context_00,0);
  }
  if (microatf_context->expect == MICROATF_EXPECT_PASS) {
    args_1[0].overflow_arg_area = local_138;
    args_1[0]._0_8_ = &stack0x00000008;
    local_58._4_4_ = 0x30;
    local_58._0_4_ = 8;
    microatf_context_write_result_pack(microatf_context,"failed",-1,msg,(__va_list_tag *)local_58);
    microatf_context_exit(context_00,1);
  }
  args_2[0].overflow_arg_area = local_138;
  args_2[0]._0_8_ = &stack0x00000008;
  file._4_4_ = 0x30;
  file._0_4_ = 0x18;
  uVar2 = (ulong)(uint)local_128;
  microatf_context_write_result
            (microatf_context,"failed",-1,"%s:%d: %s",uVar1,uVar2,
             "Test case raised a failure but was not expecting one");
  microatf_context_exit(context_00,1);
}

Assistant:

void
microatf_fail_require(char const *msg, ...)
{
	microatf_context_t *context = microatf_context;

	if (context->expect == MICROATF_EXPECT_FAIL) {
		va_list args;
		va_start(args, msg);
		microatf_context_write_result_pack(context, /**/
		    "expected_failure", -1, msg, args);
		va_end(args);

		microatf_context_exit(context, EXIT_SUCCESS);
	} else if (context->expect == MICROATF_EXPECT_PASS) {
		va_list args;
		va_start(args, msg);
		microatf_context_write_result_pack(context, /**/
		    "failed", -1, msg, args);
		va_end(args);

		microatf_context_exit(context, EXIT_FAILURE);
	} else {
		va_list args;
		va_start(args, msg);
		char const *file = va_arg(args, char const *);
		int line = va_arg(args, int);
		microatf_context_write_result(context, "failed", -1,
		    "%s:%d: %s", file, line,
		    "Test case raised a failure but was not expecting one");
		va_end(args);

		microatf_context_exit(context, EXIT_FAILURE);
	}
}